

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode socket_connect_result(Curl_easy *data,char *ipaddress,int error)

{
  char *pcVar1;
  char local_128 [8];
  char buffer [256];
  int error_local;
  char *ipaddress_local;
  Curl_easy *data_local;
  
  if ((error == 0xb) || (error == 0x73)) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    buffer._252_4_ = error;
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      pcVar1 = Curl_strerror(error,local_128,0x100);
      Curl_infof(data,"Immediate connect fail for %s: %s",ipaddress,pcVar1);
    }
    (data->state).os_errno = buffer._252_4_;
    data_local._4_4_ = CURLE_COULDNT_CONNECT;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode socket_connect_result(struct Curl_easy *data,
                                      const char *ipaddress, int error)
{
  switch(error) {
  case EINPROGRESS:
  case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
    /* On some platforms EAGAIN and EWOULDBLOCK are the
     * same value, and on others they are different, hence
     * the odd #if
     */
  case EAGAIN:
#endif
#endif
    return CURLE_OK;

  default:
    /* unknown error, fallthrough and try another address! */
#ifdef CURL_DISABLE_VERBOSE_STRINGS
    (void)ipaddress;
#else
    {
      char buffer[STRERROR_LEN];
      infof(data, "Immediate connect fail for %s: %s",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
    }
#endif
    data->state.os_errno = error;
    /* connect failed */
    return CURLE_COULDNT_CONNECT;
  }
}